

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face_conflict *aface)

{
  FT_Memory pFVar1;
  FT_Error FVar2;
  FT_Stream pFVar3;
  FT_Error FVar4;
  FT_Open_Args args;
  FT_Open_Args local_70;
  
  if (base == (FT_Byte *)0x0) {
    FVar4 = 6;
  }
  else {
    pFVar1 = library->memory;
    pFVar3 = (FT_Stream)(*pFVar1->alloc)(pFVar1,0x50);
    if (pFVar3 == (FT_Stream)0x0) {
      (*pFVar1->free)(pFVar1,base);
      FVar4 = 0x40;
    }
    else {
      pFVar3->read = (FT_Stream_IoFunc)0x0;
      pFVar3->close = (FT_Stream_CloseFunc)0x0;
      pFVar3->memory = (FT_Memory)0x0;
      pFVar3->cursor = (uchar *)0x0;
      (pFVar3->descriptor).value = 0;
      (pFVar3->pathname).value = 0;
      pFVar3->limit = (uchar *)0x0;
      pFVar3->base = base;
      pFVar3->size = size;
      pFVar3->pos = 0;
      pFVar3->close = memory_stream_close;
      local_70.flags = 2;
      local_70.stream = pFVar3;
      if (driver_name != (char *)0x0) {
        local_70.flags = 10;
        local_70.driver = FT_Get_Module(library,driver_name);
      }
      FVar4 = 0;
      FVar2 = ft_open_face_internal(library,&local_70,face_index,aface,'\0');
      if (FVar2 == 0) {
        (*aface)->face_flags = (*aface)->face_flags & 0xfffffffffffffbff;
      }
      else {
        if (pFVar3->close != (FT_Stream_CloseFunc)0x0) {
          (*pFVar3->close)(pFVar3);
        }
        (*pFVar1->free)(pFVar1,pFVar3);
        FVar4 = FVar2;
      }
    }
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Stream     stream = NULL;
    FT_Memory     memory = library->memory;


    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags  = FT_OPEN_STREAM;
    args.stream = stream;
    if ( driver_name )
    {
      args.flags  = args.flags | FT_OPEN_DRIVER;
      args.driver = FT_Get_Module( library, driver_name );
    }

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    error = ft_open_face_internal( library, &args, face_index, aface, 0 );

    if ( !error )
      (*aface)->face_flags &= ~FT_FACE_FLAG_EXTERNAL_STREAM;
    else
#ifdef FT_MACINTOSH
      FT_Stream_Free( stream, 0 );
#else
    {
      FT_Stream_Close( stream );
      FT_FREE( stream );
    }
#endif

    return error;
  }